

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

size_t lua_rawlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  size_t sVar3;
  uint uVar4;
  
  pTVar2 = index2addr(L,idx);
  uVar4 = pTVar2->tt_ & 0xf;
  if (uVar4 == 7) {
    sVar3 = *(size_t *)((pTVar2->value_).f + 0x20);
  }
  else if (uVar4 == 5) {
    iVar1 = luaH_getn(&((pTVar2->value_).gc)->h);
    sVar3 = (size_t)iVar1;
  }
  else if (uVar4 == 4) {
    sVar3 = *(size_t *)((pTVar2->value_).f + 0x10);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

LUA_API size_t lua_rawlen (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttypenv(o)) {
    case LUA_TSTRING: return tsvalue(o)->len;
    case LUA_TUSERDATA: return uvalue(o)->len;
    case LUA_TTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}